

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

const_ret_type __thiscall
dlib::
op_add_scalar<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
::apply(op_add_scalar<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
        *this,long r,long c)

{
  float fVar1;
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  pmVar2 = (((((this->
               super_basic_op_m<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
               ).m)->op).m)->op).m;
  lVar6 = r * (pmVar2->op).stride;
  pfVar3 = (pmVar2->op).ptr;
  lVar4 = (pmVar2->op).cols;
  fVar7 = pfVar3[lVar6];
  fVar7 = fVar7 * fVar7;
  if (1 < lVar4) {
    lVar5 = 1;
    do {
      fVar1 = pfVar3[lVar6 + lVar5];
      lVar5 = lVar5 + 1;
      fVar7 = fVar7 + fVar1 * fVar1;
    } while (lVar4 != lVar5);
  }
  return fVar7 + this->s;
}

Assistant:

const_ret_type apply (long r, long c) const
        { 
            return this->m(r,c) + s;
        }